

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O2

void __thiscall
Clasp::mt::ParallelHandler::ParallelHandler(ParallelHandler *this,ParallelSolve *ctrl,Solver *s)

{
  MessageHandler::MessageHandler(&this->super_MessageHandler);
  (this->super_MessageHandler).super_PostPropagator.super_Constraint._vptr_Constraint =
       (_func_int **)&PTR_propagate_001ea2b0;
  (this->thread_)._M_id._M_thread = 0;
  this->ctrl_ = ctrl;
  this->solver_ = s;
  this->received_ = (RecBuffer)0x0;
  (this->integrated_).ebo_.buf = (pointer)0x0;
  (this->integrated_).ebo_.size = 0;
  (this->integrated_).ebo_.cap = 0;
  this->recEnd_ = 0;
  this->intEnd_ = 0;
  *(uint *)&this->field_0x58 = *(uint *)&this->field_0x58 & 0xc0000000;
  (this->super_MessageHandler).super_PostPropagator.next = (PostPropagator *)this;
  return;
}

Assistant:

ParallelHandler::ParallelHandler(ParallelSolve& ctrl, Solver& s)
	: MessageHandler()
	, ctrl_(&ctrl)
	, solver_(&s)
	, received_(0)
	, recEnd_(0)
	, intEnd_(0)
	, error_(0)
	, win_(0)
	, up_(0) {
	this->next = this;
}